

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadable_extension_demo.cpp
# Opt level: O3

bool IntToMinMaxCast(Vector *source,Vector *result,idx_t count,CastParameters *parameters)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar7;
  undefined8 uVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  ulong uVar10;
  TemplatedValidityData<unsigned_long> *pTVar11;
  _Head_base<0UL,_unsigned_long_*,_false> _Var12;
  int32_t *dataptr;
  void *pvVar13;
  idx_t extraout_RDX;
  idx_t extraout_RDX_00;
  idx_t extraout_RDX_01;
  idx_t extraout_RDX_02;
  idx_t iVar14;
  idx_t extraout_RDX_03;
  idx_t idx;
  idx_t extraout_RDX_04;
  idx_t extraout_RDX_05;
  ulong uVar15;
  ulong uVar16;
  idx_t iVar17;
  VectorType VVar18;
  idx_t idx_in_entry;
  ulong uVar19;
  int32_t max_val;
  int32_t min_val;
  int32_t *local_c8;
  int32_t *local_c0;
  Vector *local_b8;
  void *local_b0;
  undefined8 local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_a0;
  void *local_98;
  long local_90;
  unsigned_long local_88;
  int32_t local_80;
  int32_t local_7c;
  long *local_78;
  long local_70;
  long local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  local_7c = MinMaxType::GetMinValue((LogicalType *)(result + 8));
  local_80 = MinMaxType::GetMaxValue((LogicalType *)(result + 8));
  dataptr = &local_80;
  VVar18 = (VectorType)result;
  local_c8 = &local_7c;
  local_c0 = dataptr;
  if (*source == (Vector)0x0) {
    duckdb::Vector::SetVectorType(VVar18);
    lVar5 = *(long *)(result + 0x20);
    lVar6 = *(long *)(source + 0x20);
    duckdb::FlatVector::VerifyFlatVector(source);
    duckdb::FlatVector::VerifyFlatVector(result);
    if (*(long *)(source + 0x28) == 0) {
      if (count != 0) {
        iVar17 = 0;
        iVar14 = extraout_RDX;
        do {
          iVar1 = *(int *)(lVar6 + iVar17 * 4);
          duckdb::UnaryLambdaWrapper::
          Operation<IntToMinMaxCast(duckdb::Vector&,duckdb::Vector&,unsigned_long,duckdb::CastParameters&)::__0,int,int>
                    (iVar1,(ValidityMask *)&local_c8,iVar14,dataptr);
          *(int *)(lVar5 + iVar17 * 4) = iVar1;
          iVar17 = iVar17 + 1;
          iVar14 = extraout_RDX_04;
        } while (count != iVar17);
      }
    }
    else {
      *(long *)(result + 0x28) = *(long *)(source + 0x28);
      duckdb::shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)(result + 0x30),
                 (shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)(source + 0x30));
      *(undefined8 *)(result + 0x40) = *(undefined8 *)(source + 0x40);
      if (0x3f < count + 0x3f) {
        local_b0 = (void *)(count + 0x3f >> 6);
        pvVar13 = (void *)0x0;
        iVar14 = extraout_RDX_00;
        uVar19 = 0;
        local_b8 = source;
        do {
          local_98 = pvVar13;
          if (*(long *)(source + 0x28) == 0) {
            uVar10 = uVar19 + 0x40;
            if (count <= uVar19 + 0x40) {
              uVar10 = count;
            }
LAB_00116908:
            uVar16 = uVar19;
            if (uVar19 < uVar10) {
              do {
                iVar1 = *(int *)(lVar6 + uVar19 * 4);
                duckdb::UnaryLambdaWrapper::
                Operation<IntToMinMaxCast(duckdb::Vector&,duckdb::Vector&,unsigned_long,duckdb::CastParameters&)::__0,int,int>
                          (iVar1,(ValidityMask *)&local_c8,iVar14,pvVar13);
                *(int *)(lVar5 + uVar19 * 4) = iVar1;
                uVar19 = uVar19 + 1;
                iVar14 = extraout_RDX_01;
                uVar16 = uVar10;
              } while (uVar10 != uVar19);
            }
          }
          else {
            uVar4 = *(ulong *)(*(long *)(source + 0x28) + (long)pvVar13 * 8);
            uVar10 = uVar19 + 0x40;
            if (count <= uVar19 + 0x40) {
              uVar10 = count;
            }
            uVar16 = uVar10;
            if (uVar4 != 0) {
              if (uVar4 == 0xffffffffffffffff) goto LAB_00116908;
              uVar16 = uVar19;
              source = local_b8;
              if (uVar19 < uVar10) {
                local_90 = uVar19 * 4 + lVar6;
                uVar15 = 0;
                do {
                  if ((uVar4 >> (uVar15 & 0x3f) & 1) != 0) {
                    iVar1 = *(int *)(local_90 + uVar15 * 4);
                    duckdb::UnaryLambdaWrapper::
                    Operation<IntToMinMaxCast(duckdb::Vector&,duckdb::Vector&,unsigned_long,duckdb::CastParameters&)::__0,int,int>
                              (iVar1,(ValidityMask *)&local_c8,iVar14,pvVar13);
                    *(int *)(lVar5 + uVar19 * 4 + uVar15 * 4) = iVar1;
                    iVar14 = extraout_RDX_02;
                  }
                  uVar15 = uVar15 + 1;
                  uVar16 = uVar10;
                  source = local_b8;
                } while (uVar10 - uVar19 != uVar15);
              }
            }
          }
          pvVar13 = (void *)((long)local_98 + 1);
          uVar19 = uVar16;
        } while (pvVar13 != local_b0);
      }
    }
  }
  else if (*source == (Vector)0x2) {
    duckdb::Vector::SetVectorType(VVar18);
    piVar2 = *(int **)(result + 0x20);
    piVar3 = *(int **)(source + 0x20);
    if ((*(byte **)(source + 0x28) == (byte *)0x0) || ((**(byte **)(source + 0x28) & 1) != 0)) {
      duckdb::ConstantVector::SetNull(result,false);
      iVar1 = *piVar3;
      duckdb::UnaryLambdaWrapper::
      Operation<IntToMinMaxCast(duckdb::Vector&,duckdb::Vector&,unsigned_long,duckdb::CastParameters&)::__0,int,int>
                (iVar1,(ValidityMask *)&local_c8,idx,dataptr);
      *piVar2 = iVar1;
    }
    else {
      duckdb::ConstantVector::SetNull(result,true);
    }
  }
  else {
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
    duckdb::Vector::ToUnifiedFormat((ulong)source,(UnifiedVectorFormat *)count);
    duckdb::Vector::SetVectorType(VVar18);
    lVar5 = *(long *)(result + 0x20);
    duckdb::FlatVector::VerifyFlatVector(result);
    if (local_68 == 0) {
      if (count != 0) {
        lVar6 = *local_78;
        uVar19 = 0;
        iVar14 = extraout_RDX_03;
        do {
          uVar10 = uVar19;
          if (lVar6 != 0) {
            uVar10 = (ulong)*(uint *)(lVar6 + uVar19 * 4);
          }
          iVar1 = *(int *)(local_70 + uVar10 * 4);
          duckdb::UnaryLambdaWrapper::
          Operation<IntToMinMaxCast(duckdb::Vector&,duckdb::Vector&,unsigned_long,duckdb::CastParameters&)::__0,int,int>
                    (iVar1,(ValidityMask *)&local_c8,iVar14,dataptr);
          *(int *)(lVar5 + uVar19 * 4) = iVar1;
          uVar19 = uVar19 + 1;
          iVar14 = extraout_RDX_05;
        } while (count != uVar19);
      }
    }
    else if (count != 0) {
      lVar6 = *local_78;
      uVar19 = 0;
      do {
        uVar10 = uVar19;
        if (lVar6 != 0) {
          uVar10 = (ulong)*(uint *)(lVar6 + uVar19 * 4);
        }
        pvVar13 = *(void **)(local_68 + (uVar10 >> 6) * 8);
        if (((ulong)pvVar13 >> (uVar10 & 0x3f) & 1) == 0) {
          _Var12._M_head_impl = *(unsigned_long **)(result + 0x28);
          if (_Var12._M_head_impl == (unsigned_long *)0x0) {
            local_88 = *(unsigned_long *)(result + 0x40);
            duckdb::make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_a8,&local_88);
            p_Var9 = p_Stack_a0;
            uVar8 = local_a8;
            local_a8 = 0;
            p_Stack_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            this = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
            *(undefined8 *)(result + 0x30) = uVar8;
            *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38) = p_Var9;
            if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
               p_Stack_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_a0);
            }
            pTVar11 = duckdb::shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                      operator->((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                                 (result + 0x30));
            _Var12._M_head_impl =
                 (pTVar11->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            *(unsigned_long **)(result + 0x28) = _Var12._M_head_impl;
          }
          bVar7 = (byte)uVar19 & 0x3f;
          _Var12._M_head_impl[uVar19 >> 6] =
               _Var12._M_head_impl[uVar19 >> 6] &
               (-2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7);
        }
        else {
          iVar1 = *(int *)(local_70 + uVar10 * 4);
          duckdb::UnaryLambdaWrapper::
          Operation<IntToMinMaxCast(duckdb::Vector&,duckdb::Vector&,unsigned_long,duckdb::CastParameters&)::__0,int,int>
                    (iVar1,(ValidityMask *)&local_c8,uVar10 >> 6,pvVar13);
          *(int *)(lVar5 + uVar19 * 4) = iVar1;
        }
        uVar19 = uVar19 + 1;
      } while (count != uVar19);
    }
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
  }
  return true;
}

Assistant:

static bool IntToMinMaxCast(Vector &source, Vector &result, idx_t count, CastParameters &parameters) {
	auto &ty = result.GetType();
	auto min_val = MinMaxType::GetMinValue(ty);
	auto max_val = MinMaxType::GetMaxValue(ty);
	UnaryExecutor::Execute<int32_t, int32_t>(source, result, count, [&](int32_t input) {
		if (input < min_val || input > max_val) {
			throw ConversionException(StringUtil::Format("Value %s is outside of range [%s,%s]", to_string(input),
			                                             to_string(min_val), to_string(max_val)));
		}
		return input;
	});
	return true;
}